

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::UInt32Size(RepeatedField<unsigned_int> *value)

{
  uint uVar1;
  uint uVar2;
  int in_ECX;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  
  uVar2 = value->current_size_;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = *(uint *)((long)value->arena_or_elements_ + uVar4 * 4);
    auVar6._0_4_ = -(uint)(-0x7fffff81 < (int)(uVar1 ^ 0x80000000));
    auVar6._4_4_ = -(uint)(-0x7fffc001 < (int)(uVar1 ^ 0x80000000));
    auVar6._8_4_ = -(uint)(-0x7fe00001 < (int)(uVar1 ^ 0x80000000));
    auVar6._12_4_ = -(uint)(-0x70000001 < (int)(uVar1 ^ 0x80000000));
    iVar3 = movmskps(in_ECX,auVar6);
    in_ECX = iVar3 << 2;
    uVar2 = uVar2 + ((uint)(0x4332322132212110 >> ((byte)in_ECX & 0x3f)) & 7);
  }
  return (ulong)uVar2;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}